

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void RGB24PackedToPlanar_SSE2(uint8_t *rgb,__m128i *out)

{
  __m128i *in_RSI;
  longlong *in_RDI;
  __m128i tmp [6];
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  longlong local_88;
  longlong lStack_80;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  __m128i *local_40;
  longlong *local_30;
  longlong *local_28;
  longlong *local_20;
  longlong *local_18;
  longlong *local_10;
  
  local_a8 = *in_RDI;
  lStack_a0 = in_RDI[1];
  local_10 = in_RDI + 2;
  local_98 = *local_10;
  lStack_90 = in_RDI[3];
  local_18 = in_RDI + 4;
  local_88 = *local_18;
  lStack_80 = in_RDI[5];
  local_20 = in_RDI + 6;
  local_78 = *local_20;
  lStack_70 = in_RDI[7];
  local_28 = in_RDI + 8;
  local_68 = *local_28;
  lStack_60 = in_RDI[9];
  local_30 = in_RDI + 10;
  local_58 = *local_30;
  lStack_50 = in_RDI[0xb];
  local_40 = in_RSI;
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_a8,in_RSI);
  RGB24PackedToPlanarHelper_SSE2(local_40,(__m128i *)&local_a8);
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_a8,local_40);
  RGB24PackedToPlanarHelper_SSE2(local_40,(__m128i *)&local_a8);
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_a8,local_40);
  return;
}

Assistant:

static WEBP_INLINE void RGB24PackedToPlanar_SSE2(
    const uint8_t* const rgb, __m128i* const out /*out[6]*/) {
  __m128i tmp[6];
  tmp[0] = _mm_loadu_si128((const __m128i*)(rgb +  0));
  tmp[1] = _mm_loadu_si128((const __m128i*)(rgb + 16));
  tmp[2] = _mm_loadu_si128((const __m128i*)(rgb + 32));
  tmp[3] = _mm_loadu_si128((const __m128i*)(rgb + 48));
  tmp[4] = _mm_loadu_si128((const __m128i*)(rgb + 64));
  tmp[5] = _mm_loadu_si128((const __m128i*)(rgb + 80));

  RGB24PackedToPlanarHelper_SSE2(tmp, out);
  RGB24PackedToPlanarHelper_SSE2(out, tmp);
  RGB24PackedToPlanarHelper_SSE2(tmp, out);
  RGB24PackedToPlanarHelper_SSE2(out, tmp);
  RGB24PackedToPlanarHelper_SSE2(tmp, out);
}